

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::FindEntryWithKey<unsigned_int>
          (BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,uint *key,int *i,int *last,uint *targetBucket)

{
  Type piVar1;
  Type pSVar2;
  bool bVar3;
  hash_t hashCode_00;
  uint uVar4;
  EntryType *localEntries;
  hash_t hashCode;
  int *localBuckets;
  uint depth;
  uint *targetBucket_local;
  int *last_local;
  int *i_local;
  uint *key_local;
  BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  localBuckets._4_4_ = 0;
  piVar1 = this->buckets;
  if (piVar1 != (Type)0x0) {
    hashCode_00 = GetHashCodeWithKey<unsigned_int>(key);
    uVar4 = GetBucket(this,hashCode_00);
    *targetBucket = uVar4;
    *last = -1;
    pSVar2 = this->entries;
    *i = piVar1[*targetBucket];
    while (-1 < *i) {
      bVar3 = DefaultHashedEntry<unsigned_int,Func::InstrByteCodeRegisterUses,JsUtil::(anonymous_namespace)::KeyValueEntry>
              ::KeyEquals<DefaultComparer<unsigned_int>,unsigned_int>
                        ((DefaultHashedEntry<unsigned_int,Func::InstrByteCodeRegisterUses,JsUtil::(anonymous_namespace)::KeyValueEntry>
                          *)(pSVar2 + *i),key,hashCode_00);
      if (bVar3) {
        if (this->stats != (Type)0x0) {
          DictionaryStats::Lookup(this->stats,localBuckets._4_4_);
        }
        return true;
      }
      localBuckets._4_4_ = localBuckets._4_4_ + 1;
      *last = *i;
      *i = pSVar2[*i].
           super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
           .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
           super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
           .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.next;
    }
  }
  if (this->stats != (Type)0x0) {
    DictionaryStats::Lookup(this->stats,localBuckets._4_4_);
  }
  return false;
}

Assistant:

inline bool FindEntryWithKey(const LookupType& key, int *const i, int *const last, uint *const targetBucket)
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                *targetBucket = this->GetBucket(hashCode);
                *last = -1;
                EntryType * localEntries = entries;
                for (*i = localBuckets[*targetBucket]; *i >= 0; *last = *i, *i = localEntries[*i].next)
                {
                    if (localEntries[*i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return true;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }
#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return false;
        }